

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_ObjectRenderingAttributes::Read(ON_ObjectRenderingAttributes *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_39;
  bool local_2a;
  bool local_29;
  int local_28;
  bool b;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_ObjectRenderingAttributes *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_24 = 0;
  local_28 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (bVar1) {
    local_39 = iStack_24 == 1 && 0 < local_28;
    local_29 = local_39;
    if (local_39) {
      if (iStack_24 == 1 && 0 < local_28) {
        local_29 = ON_BinaryArchive::ReadArray(_minor_version,(ON_ClassArray<ON_MaterialRef> *)this)
        ;
      }
      if (local_29 != false) {
        if (local_29 != false) {
          local_29 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_mappings);
        }
        if ((((local_29 != false) && (1 < local_28)) &&
            (local_29 = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bCastsShadows), local_29)
            ) && ((local_29 = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bReceivesShadows),
                  local_29 && (2 < local_28)))) {
          local_2a = AdvancedTexturePreview(this);
          local_29 = ON_BinaryArchive::ReadBool(_minor_version,&local_2a);
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = false;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ObjectRenderingAttributes::Read( ON_BinaryArchive& archive )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if (!rc)
    return false;
  for(;;)
  {
    rc = ( 1 == major_version && minor_version >= 1 );
    if (!rc) break;

    // DO NOT CALL ON_RenderingAttributes::Read
    if (rc) rc = archive.ReadArray(m_materials);
    if (!rc) break;
    if (rc) rc = archive.ReadArray(m_mappings);
    if (!rc) break;

    if ( minor_version <= 1 )
      break;

    // version 1.2 fields added 20061129
    rc = archive.ReadBool(&m_bCastsShadows);
    if ( !rc ) break;
    rc = archive.ReadBool(&m_bReceivesShadows);
    if ( !rc ) break;

    if ( minor_version <= 2 )
      break;

    // version 1.3 fields added 20101019
    bool b = AdvancedTexturePreview();
    rc = archive.ReadBool(&b);
    if ( !rc ) break;
    // Jussi 20120430: We don't want to enable advanced texture preview by default. It will be
    //                 turned on when needed (depending on active render plug-in etc).
    //EnableAdvancedTexturePreview(b);

    break;
  }
  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}